

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

InterfaceHandle __thiscall
helics::CommonCore::getInput(CommonCore *this,LocalFederateId federateID,string_view key)

{
  BaseType BVar1;
  BasicHandleInfo *pBVar2;
  shared_mutex *__rwlock;
  
  __rwlock = &(this->handles).m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  pBVar2 = HandleManager::getInterfaceHandle(&(this->handles).m_obj,key,INPUT);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  BVar1 = -1700000000;
  if ((pBVar2->local_fed_id).fid == federateID.fid) {
    BVar1 = (pBVar2->handle).handle.hid;
  }
  return (InterfaceHandle)BVar1;
}

Assistant:

InterfaceHandle CommonCore::getInput(LocalFederateId federateID, std::string_view key) const
{
    const auto* info = handles.read(
        [&key](auto& hand) { return hand.getInterfaceHandle(key, InterfaceType::INPUT); });
    if (info->local_fed_id != federateID) {
        return {};
    }
    return info->getInterfaceHandle();
}